

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
CMeshClosestPointMapper::SeamTool::IntersectsSeams
          (SeamTool *this,int count,ON_3dPoint *pPts,double tolerance)

{
  ON_3dVector delta;
  double *a_min;
  double *a_max;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  undefined1 local_98 [8];
  ON_RTreeSearchResult sr;
  ON__INT_PTR sr_id;
  double local_78;
  double local_70;
  int local_64;
  undefined1 local_60 [4];
  int i;
  ON_BoundingBox bbox;
  double tolerance_local;
  ON_3dPoint *pPts_local;
  int count_local;
  SeamTool *this_local;
  
  bbox.m_max.z = tolerance;
  if ((this->m_bProcessed & 1U) == 0) {
    Process(this);
  }
  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_60);
  for (local_64 = 0; local_64 < count; local_64 = local_64 + 1) {
    ON_BoundingBox::Set((ON_BoundingBox *)local_60,pPts + local_64,1);
  }
  ON_3dVector::ON_3dVector((ON_3dVector *)&sr_id,bbox.m_max.z,bbox.m_max.z,bbox.m_max.z);
  delta.y = local_78;
  delta.x = (double)sr_id;
  delta.z = local_70;
  ON_BoundingBox::Expand((ON_BoundingBox *)local_60,delta);
  sr.m_id = (ON__INT_PTR *)0x0;
  memset(local_98,0,0x10);
  local_98._0_4_ = 1;
  sr._0_8_ = &sr.m_id;
  ON_BoundingBox::Min(&local_b0,(ON_BoundingBox *)local_60);
  a_min = ON_3dPoint::operator_cast_to_double_(&local_b0);
  ON_BoundingBox::Max(&local_c8,(ON_BoundingBox *)local_60);
  a_max = ON_3dPoint::operator_cast_to_double_(&local_c8);
  ON_RTree::Search(&this->m_seamTree,a_min,a_max,(ON_RTreeSearchResult *)local_98);
  return 0 < (int)local_98._4_4_;
}

Assistant:

bool IntersectsSeams(int count, const ON_3dPoint* pPts, double tolerance) const
    {
      if (!m_bProcessed)
        Process();

      ON_BoundingBox bbox;
      for (int i = 0; i < count; i++)
      {
        bbox.Set(pPts[i], 1);
      }
      bbox.Expand(ON_3dVector(tolerance, tolerance, tolerance));
      ON__INT_PTR sr_id = 0;
      ON_RTreeSearchResult sr;
      memset(&sr, 0, sizeof(sr));
      sr.m_capacity = 1;
      sr.m_id = &sr_id;
      m_seamTree.Search(bbox.Min(), bbox.Max(), sr);
      if (sr.m_count > 0)
        return true;
      return false;
    }